

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O1

void __thiscall
YacclabTests::CheckAlgorithms<void(Labeling::*)(int,int,int),int,int,int>
          (YacclabTests *this,string *title,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms,offset_in_Labeling_to_subr func,int *args,int *args_1,int *args_2)

{
  pointer pcVar1;
  GlobalConfig *pGVar2;
  bool bVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  Labeling *pLVar10;
  pointer pbVar11;
  path *ppVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  code *pcVar13;
  undefined4 extraout_var_01;
  long *plVar14;
  undefined8 *puVar15;
  size_type *psVar16;
  ulong *puVar17;
  ulong uVar18;
  String *rhs;
  pointer pbVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  long lVar21;
  undefined8 uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer lhs;
  _Bit_iterator _Var24;
  undefined4 *in_stack_00000010;
  string dataset_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  path is_path;
  unique_ptr<YacclabTensorOutput,_std::default_delete<YacclabTensorOutput>_> labels_correct;
  out_of_range anon_var_0;
  path filename_path;
  vector<bool,_std::allocator<bool>_> stats;
  string correct_algo_name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_fail;
  OutputBox ob;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  long *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  Labeling *local_250;
  code *local_248;
  long *local_240;
  long local_238;
  long local_230 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  vector<bool,_std::allocator<bool>_> local_200;
  ulong local_1d8;
  pointer local_1d0;
  string local_1c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_1a8;
  path local_190;
  long *local_170;
  long local_168;
  long local_160 [2];
  YacclabTests *local_150;
  ulong local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  size_t local_138;
  ulong local_130;
  int *local_128;
  int *local_120;
  path local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  OutputBox local_e0;
  
  local_248 = (code *)func;
  local_128 = args;
  local_120 = args_1;
  OutputBox::OutputBox(&local_e0,title,0x50,2);
  local_2f8._M_dataplus._M_p._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_200,
             (long)(ccl_algorithms->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(ccl_algorithms->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_2f8,
             (allocator_type *)&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_2f8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  pLVar10 = LabelingMapSingleton::GetLabeling
                      ((ccl_algorithms->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  (*pLVar10->_vptr_Labeling[7])(&local_2f8,pLVar10);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  local_250 = LabelingMapSingleton::GetLabeling(&local_1c8);
  pbVar11 = (this->mode_cfg_->check_datasets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mode_cfg_->check_datasets).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar11) {
    local_1d8 = 0;
    uVar18 = 0;
    local_150 = this;
    local_140 = ccl_algorithms;
    do {
      paVar20 = &local_2f8.field_2;
      paVar23 = &local_2b8.field_2;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      pcVar1 = pbVar11[uVar18]._M_dataplus._M_p;
      local_148 = uVar18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d8,pcVar1,pcVar1 + pbVar11[uVar18]._M_string_length);
      pGVar2 = this->glob_cfg_;
      filesystem::path::path((path *)&local_298,&local_2d8);
      pcVar1 = (pGVar2->input_path).path_._M_dataplus._M_p;
      local_2f8._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,pcVar1,pcVar1 + (pGVar2->input_path).path_._M_string_length);
      ppVar12 = filesystem::path::operator/=((path *)&local_2f8,(path *)&local_298);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar1 = (ppVar12->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,pcVar1,pcVar1 + (ppVar12->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != paVar20) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      filesystem::path::path((path *)&local_2b8,&this->glob_cfg_->input_txt);
      local_2f8._M_dataplus._M_p = (pointer)paVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f8,local_270._M_dataplus._M_p,
                 local_270._M_dataplus._M_p + local_270._M_string_length);
      ppVar12 = filesystem::path::operator/=((path *)&local_2f8,(path *)&local_2b8);
      local_298._M_allocated_capacity = (size_type)&local_288;
      pcVar1 = (ppVar12->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar1,pcVar1 + (ppVar12->path_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != paVar20) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != paVar23) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      local_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = LoadFileList(this,&local_1a8,(path *)&local_298);
      ppVar5 = local_1a8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = local_1a8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        local_138 = ((long)local_1a8.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1a8.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        OutputBox::StartUnitaryBox(&local_e0,&local_2d8,local_138);
        if ((ppVar5 != ppVar4) && ((local_1d8 & 1) == 0)) {
          uVar18 = 0;
          do {
            paVar20 = &local_2f8.field_2;
            ProgressBar::Display(&local_e0.pb,(uint)uVar18);
            pcVar1 = local_1a8.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar18].first._M_dataplus._M_p;
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            local_130 = uVar18;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b8,pcVar1,
                       pcVar1 + local_1a8.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar18].first.
                                _M_string_length);
            filesystem::path::path((path *)&local_220,&local_2b8);
            local_2f8._M_dataplus._M_p = (pointer)paVar20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f8,local_270._M_dataplus._M_p,
                       local_270._M_dataplus._M_p + local_270._M_string_length);
            ppVar12 = filesystem::path::operator/=((path *)&local_2f8,(path *)&local_220);
            local_240 = local_230;
            pcVar1 = (ppVar12->path_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_240,pcVar1,pcVar1 + (ppVar12->path_)._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != paVar20) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            pLVar10 = LabelingMapSingleton::GetLabeling
                                ((ccl_algorithms->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
            iVar8 = (*pLVar10->_vptr_Labeling[9])(pLVar10);
            local_2f8._M_dataplus._M_p = (pointer)paVar20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f8,local_240,local_238 + (long)local_240);
            cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x20))
                              ((long *)CONCAT44(extraout_var,iVar8),&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != paVar20) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (cVar7 == '\0') {
              std::operator+(&local_220,"Unable to open \'",&local_2b8);
              puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
              psVar16 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_2f8.field_2._M_allocated_capacity = *psVar16;
                local_2f8.field_2._8_8_ = puVar15[3];
                local_2f8._M_dataplus._M_p = (pointer)paVar20;
              }
              else {
                local_2f8.field_2._M_allocated_capacity = *psVar16;
                local_2f8._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_2f8._M_string_length = puVar15[1];
              *puVar15 = psVar16;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              OutputBox::Cmessage(&local_e0,&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != paVar20) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              (*local_250->_vptr_Labeling[2])();
              iVar8 = (*local_250->_vptr_Labeling[10])();
              plVar14 = (long *)CONCAT44(extraout_var_00,iVar8);
              (**(code **)(*plVar14 + 0x28))(plVar14);
              (**(code **)(*plVar14 + 0x40))(&local_278,plVar14);
              (*local_250->_vptr_Labeling[5])();
              plVar14 = local_278;
              uVar9 = (*local_250->_vptr_Labeling[8])();
              (**(code **)(*plVar14 + 0x18))(plVar14,uVar9 & 0xff);
              pbVar11 = (ccl_algorithms->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_1d0 = (ccl_algorithms->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              if (pbVar11 != local_1d0) {
                uVar18 = 0;
                do {
                  pLVar10 = LabelingMapSingleton::GetLabeling(pbVar11);
                  if ((local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6]
                       >> (uVar18 & 0x3f) & 1) == 0) {
LAB_001dfd20:
                    uVar18 = (ulong)((int)uVar18 + 1);
                    bVar3 = false;
                  }
                  else {
                    plVar14 = (long *)((long)&pLVar10->_vptr_Labeling + (long)local_128);
                    pcVar13 = local_248;
                    if (((ulong)local_248 & 1) != 0) {
                      pcVar13 = *(code **)(local_248 + *plVar14 + -1);
                    }
                    (*pcVar13)(plVar14,*local_120,*args_2,*in_stack_00000010);
                    iVar8 = (*pLVar10->_vptr_Labeling[10])(pLVar10);
                    plVar14 = (long *)CONCAT44(extraout_var_01,iVar8);
                    (**(code **)(*plVar14 + 0x28))(plVar14);
                    uVar9 = (*pLVar10->_vptr_Labeling[8])(pLVar10);
                    (**(code **)(*plVar14 + 0x18))(plVar14,uVar9 & 0xff);
                    cVar7 = (**(code **)(*local_278 + 0x38))(local_278,plVar14);
                    (*pLVar10->_vptr_Labeling[5])(pLVar10);
                    if (cVar7 == '\0') {
                      local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18 >> 6] =
                           local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar18 >> 6] & ~(1L << ((byte)uVar18 & 0x3f));
                      filesystem::path::path(&local_190,&local_2d8);
                      filesystem::path::path(&local_118,&local_2b8);
                      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2f8,local_190.path_._M_dataplus._M_p,
                                 local_190.path_._M_dataplus._M_p + local_190.path_._M_string_length
                                );
                      ppVar12 = filesystem::path::operator/=((path *)&local_2f8,&local_118);
                      pcVar1 = (ppVar12->path_)._M_dataplus._M_p;
                      local_170 = local_160;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_170,pcVar1,
                                 pcVar1 + (ppVar12->path_)._M_string_length);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                        operator_delete(local_2f8._M_dataplus._M_p,
                                        local_2f8.field_2._M_allocated_capacity + 1);
                      }
                      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_220,local_170,local_168 + (long)local_170);
                      std::__cxx11::string::operator=
                                ((string *)
                                 (local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar18),
                                 (string *)&local_220);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_220._M_dataplus._M_p != &local_220.field_2) {
                        operator_delete(local_220._M_dataplus._M_p,
                                        local_220.field_2._M_allocated_capacity + 1);
                      }
                      if (local_170 != local_160) {
                        operator_delete(local_170,local_160[0] + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118.path_._M_dataplus._M_p != &local_118.path_.field_2) {
                        operator_delete(local_118.path_._M_dataplus._M_p,
                                        local_118.path_.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_190.path_._M_dataplus._M_p != &local_190.path_.field_2) {
                        operator_delete(local_190.path_._M_dataplus._M_p,
                                        local_190.path_.field_2._M_allocated_capacity + 1);
                      }
                      _Var24 = std::
                               __adjacent_find<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_comp_iter<std::not_equal_to<int>>>
                                         (local_200.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p,0,
                                          local_200.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p);
                      if ((_Var24.super__Bit_iterator_base._M_p !=
                           local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                         (_Var24.super__Bit_iterator_base._M_offset !=
                          local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))
                      goto LAB_001dfb3d;
                      bVar6 = false;
                      local_1d8 = CONCAT71(_Var24.super__Bit_iterator_base._M_p._1_7_,1);
                      bVar3 = true;
                    }
                    else {
LAB_001dfb3d:
                      bVar3 = false;
                      bVar6 = true;
                    }
                    if (bVar6) goto LAB_001dfd20;
                  }
                } while ((!bVar3) && (pbVar11 = pbVar11 + 1, pbVar11 != local_1d0));
              }
              ccl_algorithms = local_140;
              if (local_278 != (long *)0x0) {
                (**(code **)(*local_278 + 0x10))();
                ccl_algorithms = local_140;
              }
            }
            if (local_240 != local_230) {
              operator_delete(local_240,local_230[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar18 = (ulong)((int)local_130 + 1);
          } while ((uVar18 < local_138) && ((local_1d8 & 1) == 0));
        }
        ProgressBar::End(&local_e0.pb);
        OutputBox::PrintSeparatorLine(&local_e0);
      }
      else {
        local_240 = local_230;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,local_298._M_allocated_capacity,
                   local_298._8_8_ + local_298._M_allocated_capacity);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0x311cf4);
        psVar16 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_2b8.field_2._M_allocated_capacity = *psVar16;
          local_2b8.field_2._8_8_ = plVar14[3];
          local_2b8._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar16;
          local_2b8._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_2b8._M_string_length = plVar14[1];
        *plVar14 = (long)psVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
        psVar16 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_2f8.field_2._M_allocated_capacity = *psVar16;
          local_2f8.field_2._8_8_ = puVar15[3];
          local_2f8._M_dataplus._M_p = (pointer)paVar20;
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar16;
          local_2f8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_2f8._M_string_length = puVar15[1];
        *puVar15 = psVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        OutputBox::Cwarning(&local_e0,&local_2f8,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != paVar20) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar23) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if (local_240 != local_230) {
          operator_delete(local_240,local_230[0] + 1);
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~vector(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      this = local_150;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      uVar18 = local_148;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pbVar11 = (this->mode_cfg_->check_datasets).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(this->mode_cfg_->check_datasets).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5)
            );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2b8,
           (ulong)((long)(ccl_algorithms->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(ccl_algorithms->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff,
           (allocator_type *)&local_2f8);
  pbVar11 = (ccl_algorithms->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar19 = (ccl_algorithms->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  rhs = pbVar11 + 1;
  lhs = pbVar11;
  if (rhs != pbVar19 && pbVar11 != pbVar19) {
    do {
      bVar6 = CompareLengthCvString(lhs,rhs);
      pbVar11 = rhs;
      if (!bVar6) {
        pbVar11 = lhs;
      }
      rhs = rhs + 1;
      lhs = pbVar11;
    } while (rhs != pbVar19);
  }
  pbVar19 = (ccl_algorithms->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (ccl_algorithms->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 != local_1d0) {
    local_248 = (code *)(ulong)(uint)pbVar11->_M_string_length;
    uVar9 = 0;
    do {
      std::operator+(&local_270,"\'",pbVar19);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      puVar17 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_2d8.field_2._M_allocated_capacity = *puVar17;
        local_2d8.field_2._8_8_ = plVar14[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *puVar17;
        local_2d8._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_2d8._M_string_length = plVar14[1];
      *plVar14 = (long)puVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      local_298._M_allocated_capacity = (size_type)&local_288;
      std::__cxx11::string::_M_construct
                ((ulong)&local_298,(char)local_248 - (char)pbVar19->_M_string_length);
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        uVar22 = local_2d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_298._8_8_ + local_2d8._M_string_length) {
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity != &local_288) {
          uVar22 = local_288._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_298._8_8_ + local_2d8._M_string_length) goto LAB_001e01d9;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
      }
      else {
LAB_001e01d9:
        puVar15 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2d8,local_298._M_allocated_capacity);
      }
      psVar16 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_2f8.field_2._M_allocated_capacity = *psVar16;
        local_2f8.field_2._8_8_ = puVar15[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar16;
        local_2f8._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_2f8._M_string_length = puVar15[1];
      *puVar15 = psVar16;
      puVar15[1] = 0;
      *(undefined1 *)psVar16 = 0;
      uVar18 = (ulong)uVar9;
      lVar21 = uVar18 * 0x20;
      std::__cxx11::string::operator=
                ((string *)(local_2b8._M_dataplus._M_p + lVar21),(string *)&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >> (uVar18 & 0x3f) & 1) == 0) {
        std::operator+(&local_2d8,"-> NOT correct, it first fails on \'",
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar18);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        psVar16 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_2f8.field_2._M_allocated_capacity = *psVar16;
          local_2f8.field_2._8_8_ = puVar15[3];
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar16;
          local_2f8._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_2f8._M_string_length = puVar15[1];
        *puVar15 = psVar16;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  (local_2b8._M_dataplus._M_p + lVar21,(ulong)local_2f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append(local_2b8._M_dataplus._M_p + lVar21);
      }
      uVar9 = uVar9 + 1;
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != local_1d0);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Report","");
  OutputBox::DisplayReport
            (&local_e0,&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_200.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.pre_message_._M_dataplus._M_p != &local_e0.pb.pre_message_.field_2) {
    operator_delete(local_e0.pb.pre_message_._M_dataplus._M_p,
                    local_e0.pb.pre_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.pb.post_message_._M_dataplus._M_p != &local_e0.pb.post_message_.field_2) {
    operator_delete(local_e0.pb.post_message_._M_dataplus._M_p,
                    local_e0.pb.post_message_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.title_._M_dataplus._M_p != &local_e0.title_.field_2) {
    operator_delete(local_e0.title_._M_dataplus._M_p,
                    local_e0.title_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CheckAlgorithms(const std::string& title, const std::vector<std::string>& ccl_algorithms, const FnP func, Args&&... args) {

		OutputBox ob(title);

		std::vector<bool> stats(ccl_algorithms.size(), true);  // True if the i-th algorithm is correct, false otherwise
		std::vector<std::string> first_fail(ccl_algorithms.size());  // Name of the file on which algorithm fails the first time
		bool stop = false; // True if all the algorithms are not correct

		std::string correct_algo_name;
		try {
			correct_algo_name = LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->CheckAlg();
		}
		catch (std::out_of_range) {
			ob.Cwarning("No correct algorithm is available, correctness test skipped.");
			return;
		}
		Labeling* correct_algo = LabelingMapSingleton::GetLabeling(correct_algo_name);

		for (unsigned i = 0; i < mode_cfg_.check_datasets.size(); ++i) { // For every dataset in the check_datasets list
			std::string dataset_name(mode_cfg_.check_datasets[i]);
			path dataset_path(glob_cfg_.input_path / path(dataset_name));
			path is_path = dataset_path / path(glob_cfg_.input_txt); // files.txt path

			// Load list of images on which ccl_algorithms must be tested
			std::vector<std::pair<std::string, bool>> filenames; // first: filename, second: state of filename (find or not)
			if (!LoadFileList(filenames, is_path)) {
				ob.Cwarning("Unable to open '" + is_path.string() + "'", dataset_name);
				continue;
			}

			// Number of files
			size_t filenames_size = filenames.size();
			ob.StartUnitaryBox(dataset_name, filenames_size);

			for (unsigned file = 0; file < filenames_size && !stop; ++file) { // For each file in list
				ob.UpdateUnitaryBox(file);

				std::string filename = filenames[file].first;
				path filename_path = dataset_path / path(filename);

				// Load image
				if (!LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
					ob.Cmessage("Unable to open '" + filename + "'");
					continue;
				}

				// These variables aren't necessary
				// unsigned n_labels_correct, n_labels_to_control;
				
				correct_algo->PerformLabeling();
				//n_labels_correct = sauf->n_labels_;
                YacclabTensorOutput* correct_algo_out = correct_algo->GetOutput();
                correct_algo_out->PrepareForCheck();

                std::unique_ptr<YacclabTensorOutput> labels_correct = correct_algo_out->Copy();

                correct_algo->FreeLabelingData();

                labels_correct->NormalizeLabels(correct_algo->IsLabelBackground());

				unsigned j = 0;
				for (const auto& algo_name : ccl_algorithms) {
					Labeling *algorithm = LabelingMapSingleton::GetLabeling(algo_name);

					// Perform labeling on current algorithm if it has no previously failed
					if (stats[j]) {
						(algorithm->*func)(std::forward<Args>(args)...);
                        YacclabTensorOutput* labels_to_check = algorithm->GetOutput();
                        labels_to_check->PrepareForCheck();
                        labels_to_check->NormalizeLabels(algorithm->IsLabelBackground());
                        const bool correct = labels_correct->Equals(labels_to_check);
                        // const bool diff = algorithm->Check(correct_algo);
						algorithm->FreeLabelingData();
						if (!correct) {
							stats[j] = false;
							first_fail[j] = (path(dataset_name) / path(filename)).string();

							// Stop check test if all the algorithms fail
							if (adjacent_find(stats.begin(), stats.end(), std::not_equal_to<int>()) == stats.end()) {
								stop = true;
								break;
							}
						}
					}
					++j;
				} // For all the Algorithms in the array
                //correct_algo->FreeLabelingData();

			}// END WHILE (LIST OF IMAGES)
			ob.StopUnitaryBox();
		}// END FOR (LIST OF DATASETS)

		// LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->ReleaseInput();

		 // To display report of correctness test
		std::vector<std::string> messages(static_cast<unsigned int>(ccl_algorithms.size()));
		unsigned longest_name = static_cast<unsigned>(max_element(ccl_algorithms.begin(), ccl_algorithms.end(), CompareLengthCvString)->length());

		unsigned j = 0;
		for (const auto& algo_name : ccl_algorithms) {
			messages[j] = "'" + algo_name + "'" + std::string(longest_name - algo_name.size(), '-');
			if (stats[j]) {
				messages[j] += "-> correct!";
			}
			else {
				messages[j] += "-> NOT correct, it first fails on '" + first_fail[j] + "'";
			}
			++j;
		}
		ob.DisplayReport("Report", messages);
	}